

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::Metadata::_InternalSerialize
          (Metadata *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  long lVar1;
  void *data;
  undefined8 *puVar2;
  int size;
  ulong uVar3;
  ulong uVar4;
  undefined8 *puVar5;
  size_t __n;
  const_iterator it;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  Metadata *local_50;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  puVar2 = (undefined8 *)((ulong)(this->shortdescription_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar1 = puVar2[1];
  if (lVar1 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar2,(int)lVar1,SERIALIZE,"CoreML.Specification.Metadata.shortDescription"
              );
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(string *)
                                 ((ulong)(this->shortdescription_).tagged_ptr_.ptr_ &
                                 0xfffffffffffffffe),target);
  }
  puVar2 = (undefined8 *)((ulong)(this->versionstring_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar1 = puVar2[1];
  if (lVar1 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar2,(int)lVar1,SERIALIZE,"CoreML.Specification.Metadata.versionString");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,(string *)
                                 ((ulong)(this->versionstring_).tagged_ptr_.ptr_ &
                                 0xfffffffffffffffe),target);
  }
  puVar2 = (undefined8 *)((ulong)(this->author_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar1 = puVar2[1];
  if (lVar1 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar2,(int)lVar1,SERIALIZE,"CoreML.Specification.Metadata.author");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,3,(string *)
                                 ((ulong)(this->author_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                        target);
  }
  puVar2 = (undefined8 *)((ulong)(this->license_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar1 = puVar2[1];
  if (lVar1 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar2,(int)lVar1,SERIALIZE,"CoreML.Specification.Metadata.license");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,4,(string *)
                                 ((ulong)(this->license_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                        target);
  }
  uVar4 = (this->userdefined_).map_.elements_.num_elements_;
  if (uVar4 != 0) {
    local_48.m_ = (InnerMap *)&this->userdefined_;
    if ((uVar4 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::InnerMap::
      iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::SearchFrom(&local_48,(this->userdefined_).map_.elements_.index_of_first_non_null_);
      local_68.bucket_index_ = local_48.bucket_index_;
      local_68.m_ = local_48.m_;
      local_68.node_ = local_48.node_;
      while (local_68.node_ != (Node *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                 ::InternalSerialize(100,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_68.node_,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(local_68.node_)->field_0x20,target,stream);
        _InternalSerialize(unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)::
        string_>_const__(&(local_68.node_)->kv);
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::InnerMap::
        iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&local_68);
      }
    }
    else {
      puVar2 = (undefined8 *)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 << 3);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::InnerMap::
      iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::SearchFrom(&local_48,(this->userdefined_).map_.elements_.index_of_first_non_null_);
      local_68.bucket_index_ = local_48.bucket_index_;
      local_68.node_ = local_48.node_;
      local_68.m_ = local_48.m_;
      if (local_48.node_ != (Node *)0x0) {
        uVar4 = 0;
        puVar5 = puVar2;
        local_50 = this;
        do {
          uVar3 = uVar4;
          *puVar5 = local_68.node_;
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::InnerMap::
          iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator++(&local_68);
          uVar4 = uVar3 + 1;
          puVar5 = puVar5 + 1;
        } while (local_68.node_ != (Node *)0x0);
        this = local_50;
        if (uVar4 != 0) {
          lVar1 = 0x3f;
          if (uVar4 != 0) {
            for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
            }
          }
          std::
          __introsort_loop<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const*>>>
                    (puVar2,puVar5,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const*>>>
                    (puVar2,puVar5);
          this = local_50;
          uVar4 = 0xffffffffffffffff;
          do {
            target = google::protobuf::internal::
                     MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                     ::InternalSerialize(100,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)puVar2[uVar4 + 1],
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)puVar2[uVar4 + 1] + 1,target,stream);
            _InternalSerialize(unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)::
            string_>_const__((ConstPtr)puVar2[uVar4 + 1]);
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
        }
      }
      operator_delete__(puVar2);
    }
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    uVar4 = uVar4 & 0xfffffffffffffffc;
    data = *(void **)(uVar4 + 8);
    size = (int)*(undefined8 *)(uVar4 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)target < (long)__n) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
    }
    else {
      memcpy(target,data,__n);
      target = target + __n;
    }
  }
  return target;
}

Assistant:

uint8_t* Metadata::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.Metadata)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // string shortDescription = 1;
  if (!this->_internal_shortdescription().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_shortdescription().data(), static_cast<int>(this->_internal_shortdescription().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.shortDescription");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_shortdescription(), target);
  }

  // string versionString = 2;
  if (!this->_internal_versionstring().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_versionstring().data(), static_cast<int>(this->_internal_versionstring().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.versionString");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_versionstring(), target);
  }

  // string author = 3;
  if (!this->_internal_author().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_author().data(), static_cast<int>(this->_internal_author().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.author");
    target = stream->WriteStringMaybeAliased(
        3, this->_internal_author(), target);
  }

  // string license = 4;
  if (!this->_internal_license().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_license().data(), static_cast<int>(this->_internal_license().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.license");
    target = stream->WriteStringMaybeAliased(
        4, this->_internal_license(), target);
  }

  // map<string, string> userDefined = 100;
  if (!this->_internal_userdefined().empty()) {
    typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, std::string >::const_pointer
        ConstPtr;
    typedef ConstPtr SortItem;
    typedef ::PROTOBUF_NAMESPACE_ID::internal::CompareByDerefFirst<SortItem> Less;
    struct Utf8Check {
      static void Check(ConstPtr p) {
        (void)p;
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
          p->first.data(), static_cast<int>(p->first.length()),
          ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.Metadata.UserDefinedEntry.key");
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
          p->second.data(), static_cast<int>(p->second.length()),
          ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.Metadata.UserDefinedEntry.value");
      }
    };

    if (stream->IsSerializationDeterministic() &&
        this->_internal_userdefined().size() > 1) {
      ::std::unique_ptr<SortItem[]> items(
          new SortItem[this->_internal_userdefined().size()]);
      typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, std::string >::size_type size_type;
      size_type n = 0;
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, std::string >::const_iterator
          it = this->_internal_userdefined().begin();
          it != this->_internal_userdefined().end(); ++it, ++n) {
        items[static_cast<ptrdiff_t>(n)] = SortItem(&*it);
      }
      ::std::sort(&items[0], &items[static_cast<ptrdiff_t>(n)], Less());
      for (size_type i = 0; i < n; i++) {
        target = Metadata_UserDefinedEntry_DoNotUse::Funcs::InternalSerialize(100, items[static_cast<ptrdiff_t>(i)]->first, items[static_cast<ptrdiff_t>(i)]->second, target, stream);
        Utf8Check::Check(&(*items[static_cast<ptrdiff_t>(i)]));
      }
    } else {
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, std::string >::const_iterator
          it = this->_internal_userdefined().begin();
          it != this->_internal_userdefined().end(); ++it) {
        target = Metadata_UserDefinedEntry_DoNotUse::Funcs::InternalSerialize(100, it->first, it->second, target, stream);
        Utf8Check::Check(&(*it));
      }
    }
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.Metadata)
  return target;
}